

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

void arkErrHandler(int error_code,char *module,char *function,char *msg,void *data)

{
  char err_type [10];
  undefined8 local_20 [2];
  
  if (error_code == 99) {
    local_20[0] = 0x474e494e524157;
  }
  else {
    local_20[0] = CONCAT26(local_20[0]._6_2_,0x5200000000);
    local_20[0] = CONCAT44(local_20[0]._4_4_,0x4f525245);
  }
  if (*(FILE **)((long)data + 0x278) != (FILE *)0x0) {
    fprintf(*(FILE **)((long)data + 0x278),"\n[%s %s]  %s\n",module,local_20,function);
    fprintf(*(FILE **)((long)data + 0x278),"  %s\n\n",msg);
  }
  return;
}

Assistant:

void arkErrHandler(int error_code, const char *module,
                   const char *function, char *msg, void *data)
{
  ARKodeMem ark_mem;
  char err_type[10];

  /* data points to ark_mem here */
  ark_mem = (ARKodeMem) data;

  if (error_code == ARK_WARNING)
    sprintf(err_type,"WARNING");
  else
    sprintf(err_type,"ERROR");

#ifndef NO_FPRINTF_OUTPUT
  if (ark_mem->errfp!=NULL) {
    fprintf(ark_mem->errfp,"\n[%s %s]  %s\n",module,err_type,function);
    fprintf(ark_mem->errfp,"  %s\n\n",msg);
  }
#endif

  return;
}